

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  ImGuiGroupData *pIVar8;
  float fVar9;
  ImGuiContext *pIVar10;
  char cVar11;
  ImGuiID IVar12;
  long lVar13;
  bool bVar14;
  uint uVar15;
  ImVec2 IVar16;
  ImRect group_bb;
  ImRect local_38;
  ImVec2 local_28;
  
  pIVar10 = GImGui;
  lVar13 = (long)(GImGui->GroupStack).Size;
  if (lVar13 < 1) {
    __assert_fail("g.GroupStack.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x216f,"void ImGui::EndGroup()");
  }
  pIVar7 = GImGui->CurrentWindow;
  pIVar8 = (GImGui->GroupStack).Data;
  if (pIVar8[lVar13 + -1].WindowID != pIVar7->ID) {
    __assert_fail("group_data.WindowID == window->ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x2172,"void ImGui::EndGroup()");
  }
  fVar2 = (pIVar7->DC).CursorMaxPos.x;
  fVar3 = (pIVar7->DC).CursorMaxPos.y;
  fVar4 = pIVar8[lVar13 + -1].BackupCursorPos.x;
  fVar5 = pIVar8[lVar13 + -1].BackupCursorPos.y;
  uVar15 = -(uint)(fVar4 <= fVar2);
  local_38.Max.x = (float)(~uVar15 & (uint)fVar4 | uVar15 & (uint)fVar2);
  uVar15 = -(uint)(fVar5 <= fVar3);
  fVar9 = (float)(~uVar15 & (uint)fVar5 | uVar15 & (uint)fVar3);
  local_38.Max.y = fVar9;
  local_38.Min = pIVar8[lVar13 + -1].BackupCursorPos;
  (pIVar7->DC).CursorPos = local_38.Min;
  fVar4 = pIVar8[lVar13 + -1].BackupCursorMaxPos.x;
  fVar5 = pIVar8[lVar13 + -1].BackupCursorMaxPos.y;
  uVar15 = -(uint)(fVar2 <= fVar4);
  IVar16.x = (float)(~uVar15 & (uint)fVar2 | (uint)fVar4 & uVar15);
  uVar15 = -(uint)(fVar3 <= fVar5);
  IVar16.y = (float)(~uVar15 & (uint)fVar3 | (uint)fVar5 & uVar15);
  (pIVar7->DC).CursorMaxPos = IVar16;
  (pIVar7->DC).Indent.x = pIVar8[lVar13 + -1].BackupIndent.x;
  (pIVar7->DC).GroupOffset.x = pIVar8[lVar13 + -1].BackupGroupOffset.x;
  (pIVar7->DC).CurrLineSize = pIVar8[lVar13 + -1].BackupCurrLineSize;
  fVar2 = pIVar8[lVar13 + -1].BackupCurrLineTextBaseOffset;
  (pIVar7->DC).CurrLineTextBaseOffset = fVar2;
  if (pIVar10->LogEnabled == true) {
    pIVar10->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar8[lVar13 + -1].EmitItem == false) goto LAB_0014a521;
  fVar3 = (pIVar7->DC).PrevLineTextBaseOffset;
  uVar15 = -(uint)(fVar2 <= fVar3);
  (pIVar7->DC).CurrLineTextBaseOffset = (float)(~uVar15 & (uint)fVar2 | (uint)fVar3 & uVar15);
  local_28.y = fVar9 - local_38.Min.y;
  local_28.x = local_38.Max.x - local_38.Min.x;
  ItemSize(&local_28,-1.0);
  bVar14 = false;
  ItemAdd(&local_38,0,(ImRect *)0x0,1);
  IVar12 = pIVar10->ActiveId;
  if (pIVar8[lVar13 + -1].BackupActiveIdIsAlive != IVar12) {
    bVar14 = IVar12 != 0 && pIVar10->ActiveIdIsAlive == IVar12;
  }
  if (pIVar8[lVar13 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
    cVar11 = pIVar10->ActiveIdPreviousFrameIsAlive;
  }
  else {
    cVar11 = '\0';
  }
  if (bVar14) {
LAB_0014a4ad:
    (pIVar10->LastItemData).ID = IVar12;
  }
  else if (cVar11 != '\0') {
    IVar12 = pIVar10->ActiveIdPreviousFrame;
    goto LAB_0014a4ad;
  }
  (pIVar10->LastItemData).Rect.Min = local_38.Min;
  (pIVar10->LastItemData).Rect.Max = local_38.Max;
  if ((pIVar8[lVar13 + -1].BackupHoveredIdIsAlive == false) && (pIVar10->HoveredId != 0)) {
    pIVar1 = &(pIVar10->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar14) && (pIVar10->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar10->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar15 = (pIVar10->LastItemData).StatusFlags;
  (pIVar10->LastItemData).StatusFlags = uVar15 | 0x20;
  if ((cVar11 != '\0') && (pIVar10->ActiveId != pIVar10->ActiveIdPreviousFrame)) {
    (pIVar10->LastItemData).StatusFlags = uVar15 | 0x60;
  }
LAB_0014a521:
  iVar6 = (pIVar10->GroupStack).Size;
  if (0 < iVar6) {
    (pIVar10->GroupStack).Size = iVar6 + -1;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                ,0x717,"void ImVector<ImGuiGroupData>::pop_back() [T = ImGuiGroupData]");
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}